

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::eliminate_reshape_before_binaryop(NetOptimize *this)

{
  int iVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  Layer *pLVar4;
  Layer *pLVar5;
  pointer ppLVar6;
  pointer pBVar7;
  bool bVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __position;
  long lVar9;
  int *piVar10;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar11;
  int local_40;
  int local_3c;
  Layer *local_38;
  
  ppLVar2 = (this->super_Net).layers.
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppLVar3 = (this->super_Net).layers.
            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_3c = 0;
  do {
    iVar11 = (int)((ulong)((long)ppLVar2 - (long)ppLVar3) >> 3);
    if (iVar11 <= local_3c) {
      return 0;
    }
    bVar8 = std::operator!=(&(this->super_Net).layers.
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[local_3c]->type,"Reshape");
    if ((((!bVar8) &&
         (pLVar4 = (this->super_Net).layers.
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[local_3c], *(int *)&pLVar4[1]._vptr_Layer == 1))
        && (*(int *)((long)&pLVar4[1]._vptr_Layer + 4) == 1)) && (pLVar4[1].typeindex == 0)) {
      iVar1 = *(pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_40 = local_3c;
      while (local_40 = local_40 + 1, local_40 < iVar11) {
        bVar8 = std::operator!=(&(this->super_Net).layers.
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[local_40]->type,"BinaryOp"
                               );
        if (((!bVar8) &&
            (pLVar5 = (this->super_Net).layers.
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[local_40],
            piVar10 = (pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar5->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar10 == 8)) && ((*piVar10 == iVar1 || (piVar10[1] == iVar1))))
        break;
      }
      if (local_40 != iVar11) {
        local_38 = (this->super_Net).layers.
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[local_40];
        fprintf(_stderr,"eliminate_reshape_before_binaryop %s %s\n",(pLVar4->name)._M_dataplus._M_p,
                (local_38->name)._M_dataplus._M_p);
        iVar11 = *(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppLVar6 = (this->super_Net).layers.
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar10 = (ppLVar6[local_40]->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl
                  .super__Vector_impl_data._M_start;
        if (*piVar10 == iVar1) {
          *(local_38->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar11;
          piVar10 = (ppLVar6[local_40]->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
        if (piVar10[1] == iVar1) {
          *(int *)(*(long *)&(local_38->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data + 4) = iVar11;
        }
        lVar9 = (long)iVar11;
        pBVar7 = (this->super_Net).blobs.super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_38 = (Layer *)(lVar9 * 0x40);
        this_00 = &pBVar7[lVar9].consumers;
        __position = std::
                     __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                               ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start,
                                *(pointer *)
                                 ((long)&pBVar7[lVar9].consumers.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8),
                                &local_3c);
        std::vector<int,_std::allocator<int>_>::erase(this_00,(const_iterator)__position._M_current)
        ;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(((this->super_Net).blobs.
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start)->consumers).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl + (long)local_38),
                   &local_40);
        std::__cxx11::string::assign((char *)&pLVar4->type);
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_reshape_before_binaryop()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Reshape")
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[i];
        if (reshape->w != 1 || reshape->h != 1 || reshape->permute != 0)
            continue;

        // Reshape - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        fprintf(stderr, "eliminate_reshape_before_binaryop %s %s\n", reshape->name.c_str(), binaryop->name.c_str());

        int bottom_blob_index_final = reshape->bottoms[0];
        if (layers[j]->bottoms[0] == top_blob_index)
            binaryop->bottoms[0] = bottom_blob_index_final;
        if (layers[j]->bottoms[1] == top_blob_index)
            binaryop->bottoms[1] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumers.erase(std::find(blobs[bottom_blob_index_final].consumers.begin(), blobs[bottom_blob_index_final].consumers.end(), i));
        blobs[bottom_blob_index_final].consumers.push_back(j);
        reshape->type = "ncnnfused";
    }

    return 0;
}